

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test::
TestBody(DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test *this)

{
  bool bVar1;
  pointer pTVar2;
  char *pcVar3;
  string *lhs;
  char *in_RCX;
  char *in_R9;
  string_view full_name;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  Message local_158;
  Syntax local_150;
  Syntax local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  string local_130;
  AssertHelper local_110;
  Message local_108 [3];
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string local_e0;
  Status local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Type type;
  DescriptorPoolTypeResolverSyntaxTest_SyntaxProto3_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&type.field_0 + 0x68),
             "\n    package: \"test\"\n    name: \"foo\"\n    syntax: \"proto3\"\n    message_type { name: \"MyMessage\" }\n  "
            );
  DescriptorPoolTypeResolverSyntaxTest::BuildFile
            (&this->super_DescriptorPoolTypeResolverSyntaxTest,stack0xffffffffffffffe0);
  Type::Type((Type *)&gtest_ar_.message_);
  pTVar2 = std::
           unique_ptr<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ::operator->(&(this->super_DescriptorPoolTypeResolverSyntaxTest).resolver_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f0,"test.MyMessage");
  full_name._M_str = in_RCX;
  full_name._M_len = (size_t)local_f0._M_str;
  util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
            (&local_e0,(_anonymous_namespace_ *)local_f0._M_len,full_name);
  (*pTVar2->_vptr_TypeResolver[2])(&local_c0,pTVar2,&local_e0,&gtest_ar_.message_);
  local_b1 = absl::lts_20250127::Status::ok(&local_c0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,(internal *)local_b0,
               (AssertionResult *)
               "resolver_->ResolveMessageType(GetTypeUrl(\"test.MyMessage\"), &type).ok()","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x1cc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    testing::Message::~Message(local_108);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_14c = Type::syntax((Type *)&gtest_ar_.message_);
    local_150 = SYNTAX_PROTO3;
    testing::internal::EqHelper::
    Compare<google::protobuf::Syntax,_google::protobuf::Syntax,_nullptr>
              ((EqHelper *)local_148,"type.syntax()","Syntax::SYNTAX_PROTO3",&local_14c,&local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1cd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    lhs = Type::edition_abi_cxx11_((Type *)&gtest_ar_.message_);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
              ((EqHelper *)local_170,"type.edition()","\"\"",lhs,
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x1ce,pcVar3);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      testing::Message::~Message(&local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  Type::~Type((Type *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, SyntaxProto3) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "proto3"
    message_type { name: "MyMessage" }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  EXPECT_EQ(type.syntax(), Syntax::SYNTAX_PROTO3);
  EXPECT_EQ(type.edition(), "");
}